

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O2

REF_STATUS
ref_import_meshb_jump
          (FILE *file,REF_INT version,REF_FILEPOS *key_pos,REF_INT keyword,REF_BOOL *available,
          REF_FILEPOS *next_position)

{
  long __off;
  int iVar1;
  REF_STATUS RVar2;
  size_t sVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  REF_INT keyword_code;
  
  lVar5 = (long)keyword;
  __off = key_pos[lVar5];
  if (__off == -1) {
    *available = 0;
    *next_position = 0;
LAB_00165b5c:
    RVar2 = 0;
  }
  else {
    *available = 1;
    iVar1 = fseeko((FILE *)file,__off,0);
    if (iVar1 == 0) {
      sVar3 = fread(&keyword_code,4,1,(FILE *)file);
      if (sVar3 == 1) {
        sVar3 = (size_t)keyword_code;
        if (keyword_code == keyword) {
          RVar2 = meshb_pos(file,version,next_position);
          if (RVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x5cb,"ref_import_meshb_jump",1,"pos");
            return 1;
          }
          goto LAB_00165b5c;
        }
        pcVar6 = "keyword code";
        uVar4 = 0x5ca;
      }
      else {
        pcVar6 = "keyword code";
        lVar5 = 1;
        uVar4 = 0x5c9;
      }
    }
    else {
      sVar3 = (size_t)iVar1;
      pcVar6 = "fseeko keyword failed";
      uVar4 = 0x5c8;
      lVar5 = 0;
    }
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar4,
           "ref_import_meshb_jump",pcVar6,lVar5,sVar3);
    RVar2 = 1;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_import_meshb_jump(FILE *file, REF_INT version,
                                         REF_FILEPOS *key_pos, REF_INT keyword,
                                         REF_BOOL *available,
                                         REF_FILEPOS *next_position) {
  REF_INT keyword_code;
  REF_FILEPOS position;

  if (keyword < 0 && REF_IMPORT_MESHB_LAST_KEYWORD <= keyword) {
    *available = REF_FALSE;
    *next_position = 0;
    return REF_INVALID;
  }
  position = key_pos[keyword];

  if ((REF_FILEPOS)REF_EMPTY != position) {
    *available = REF_TRUE;
  } else {
    *available = REF_FALSE;
    *next_position = 0;
    return REF_SUCCESS;
  }
  REIS(0, fseeko(file, position, SEEK_SET), "fseeko keyword failed");
  REIS(1, fread((unsigned char *)&keyword_code, 4, 1, file), "keyword code");
  REIS(keyword, keyword_code, "keyword code");
  RSS(meshb_pos(file, version, next_position), "pos");
  return REF_SUCCESS;
}